

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O3

void __thiscall MeCab::Writer::~Writer(Writer *this)

{
  ~Writer(this);
  operator_delete(this);
  return;
}

Assistant:

Writer::~Writer() {}